

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

int __thiscall branch_and_reduce_algorithm::max_nh_vtx(branch_and_reduce_algorithm *this)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference piVar5;
  iterator iStack_78;
  int v_1;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  iterator iStack_58;
  int u_1;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  int cnt;
  int u;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  int local_18;
  int i;
  int maxN2;
  int v;
  branch_and_reduce_algorithm *this_local;
  
  i = -1;
  local_18 = 0;
  for (__range3._4_4_ = 0; __range3._4_4_ < this->n; __range3._4_4_ = __range3._4_4_ + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)__range3._4_4_);
    if (*pvVar3 < 0) {
      fast_set::clear(&this->used);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)__range3._4_4_);
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pvVar4);
      _cnt = std::vector<int,_std::allocator<int>_>::end(pvVar4);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&cnt), bVar2) {
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        iVar1 = *piVar5;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar1);
        if (*pvVar3 < 0) {
          fast_set::add(&this->used,iVar1);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      __range3_1._0_4_ = 0;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)__range3._4_4_);
      __end3_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar4);
      iStack_58 = std::vector<int,_std::allocator<int>_>::end(pvVar4);
      while (bVar2 = __gnu_cxx::operator!=(&__end3_1,&stack0xffffffffffffffa8), bVar2) {
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3_1);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->adj,(long)*piVar5);
        __end4 = std::vector<int,_std::allocator<int>_>::begin(pvVar4);
        iStack_78 = std::vector<int,_std::allocator<int>_>::end(pvVar4);
        while (bVar2 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff88), bVar2) {
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end4);
          iVar1 = *piVar5;
          bVar2 = fast_set::get(&this->used,iVar1);
          if (!bVar2) {
            __range3_1._0_4_ = (int)__range3_1 + 1;
            fast_set::add(&this->used,iVar1);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3_1);
      }
      if (local_18 < (int)__range3_1) {
        i = __range3._4_4_;
        local_18 = (int)__range3_1;
      }
    }
  }
  return i;
}

Assistant:

int branch_and_reduce_algorithm::max_nh_vtx()
{
    int v = -1;
    int maxN2 = 0;

    for (int i = 0; i < n; i++)
    {
        if (x[i] < 0)
        {
            used.clear();
            for (int u : adj[i])
            {
                if (x[u] < 0)
                    used.add(u);
            }

            int cnt = 0;
            for (int u : adj[i])
            {
                for (int v : adj[u])
                {
                    if (!used.get(v))
                    {
                        cnt++;
                        used.add(v);
                    }
                }
            }

            if (cnt > maxN2)
            {
                v = i;
                maxN2 = cnt;
            }
        }
    }

    return v;
}